

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O0

void __thiscall
AllReduceSockets::pass_down
          (AllReduceSockets *this,char *buffer,size_t parent_read_pos,size_t *children_sent_pos)

{
  unsigned_long *puVar1;
  ssize_t sVar2;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t my_bufsize;
  unsigned_long local_30;
  unsigned_long local_28;
  long *local_20;
  long local_10;
  
  local_30 = in_RDX - *in_RCX;
  local_20 = in_RCX;
  local_10 = in_RSI;
  puVar1 = std::min<unsigned_long>(&ar_buf_size,&local_30);
  local_28 = *puVar1;
  if (local_28 != 0) {
    if (*(int *)(in_RDI + 0x3c) != -1) {
      sVar2 = send(*(int *)(in_RDI + 0x3c),(void *)(local_10 + *local_20),(long)(int)local_28,0);
      if (sVar2 < (int)local_28) {
        std::operator<<((ostream *)&std::cerr,"Write to left child failed\n");
      }
    }
    if (*(int *)(in_RDI + 0x40) != -1) {
      sVar2 = send(*(int *)(in_RDI + 0x40),(void *)(local_10 + *local_20),(long)(int)local_28,0);
      if (sVar2 < (int)local_28) {
        std::operator<<((ostream *)&std::cerr,"Write to right child failed\n");
      }
    }
    *local_20 = local_28 + *local_20;
  }
  return;
}

Assistant:

void AllReduceSockets::pass_down(char* buffer, const size_t parent_read_pos, size_t& children_sent_pos)
{
  size_t my_bufsize = min(ar_buf_size, (parent_read_pos - children_sent_pos));

  if (my_bufsize > 0)
  {
    // going to pass up this chunk of data to the children
    if (socks.children[0] != -1 &&
        send(socks.children[0], buffer + children_sent_pos, (int)my_bufsize, 0) < (int)my_bufsize)
      cerr << "Write to left child failed\n";
    if (socks.children[1] != -1 &&
        send(socks.children[1], buffer + children_sent_pos, (int)my_bufsize, 0) < (int)my_bufsize)
      cerr << "Write to right child failed\n";

    children_sent_pos += my_bufsize;
  }
}